

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O0

void __thiscall
Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>::
update_filter_coefficients
          (LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false> *this,
          FilterParameters *filter_parameters)

{
  ulong __new_size;
  int scale_00;
  float *pfVar1;
  size_type sVar2;
  float fVar3;
  size_t required_buffer_size;
  float fStack_40;
  int scale;
  float local_34;
  unique_ptr<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
  local_30;
  ulong local_28;
  size_t number_of_taps;
  FilterParameters *pFStack_18;
  float high_pass_frequency;
  FilterParameters *filter_parameters_local;
  LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false> *this_local;
  
  number_of_taps._4_4_ = filter_parameters->output_cycles_per_second / 2.0;
  pFStack_18 = filter_parameters;
  filter_parameters_local = (FilterParameters *)this;
  if (0.0 < filter_parameters->high_frequency_cutoff) {
    pfVar1 = std::min<float>(&filter_parameters->high_frequency_cutoff,
                             (float *)((long)&number_of_taps + 4));
    number_of_taps._4_4_ = *pfVar1;
  }
  fVar3 = ceilf((pFStack_18->input_cycles_per_second + number_of_taps._4_4_) / number_of_taps._4_4_)
  ;
  local_28 = ((long)fVar3 | (long)(fVar3 - 9.223372e+18) & (long)fVar3 >> 0x3f) << 1 | 1;
  this->step_rate_ = pFStack_18->input_cycles_per_second / pFStack_18->output_cycles_per_second;
  this->position_error_ = 0.0;
  local_34 = (float)local_28;
  _fStack_40 = 0;
  std::make_unique<SignalProcessing::FIRFilter,unsigned_int,float_const&,double,float&,float_const&>
            ((uint *)&local_30,&local_34,(double *)pFStack_18,&fStack_40,
             (float *)((long)&number_of_taps + 4));
  std::unique_ptr<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>::
  operator=(&this->filter_,&local_30);
  std::unique_ptr<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>::
  ~unique_ptr(&local_30);
  if (((pFStack_18->input_cycles_per_second != pFStack_18->output_cycles_per_second) ||
      (NAN(pFStack_18->input_cycles_per_second) || NAN(pFStack_18->output_cycles_per_second))) ||
     (0.0 <= pFStack_18->high_frequency_cutoff)) {
    if (pFStack_18->input_cycles_per_second < pFStack_18->output_cycles_per_second ||
        pFStack_18->input_cycles_per_second == pFStack_18->output_cycles_per_second) {
      if (((pFStack_18->input_cycles_per_second != pFStack_18->output_cycles_per_second) ||
          (NAN(pFStack_18->input_cycles_per_second) || NAN(pFStack_18->output_cycles_per_second)))
         || (pFStack_18->high_frequency_cutoff < 0.0)) {
        this->conversion_ = ResampleLarger;
        goto LAB_006e01af;
      }
    }
    this->conversion_ = ResampleSmaller;
  }
  else {
    this->conversion_ = Copy;
  }
LAB_006e01af:
  scale_00 = PullLowpass<GI::AY38910::AY38910<false>_>::get_scale
                       ((PullLowpass<GI::AY38910::AY38910<false>_> *)this);
  __new_size = local_28;
  if ((this->conversion_ == ResampleSmaller) &&
     (sVar2 = std::vector<short,_std::allocator<short>_>::size(&this->input_buffer_),
     sVar2 != __new_size)) {
    if (__new_size <= this->input_buffer_depth_) {
      resample_input_buffer(this,scale_00);
      this->input_buffer_depth_ = this->input_buffer_depth_ % __new_size;
    }
    std::vector<short,_std::allocator<short>_>::resize(&this->input_buffer_,__new_size);
  }
  return;
}

Assistant:

void update_filter_coefficients(const FilterParameters &filter_parameters) {
			float high_pass_frequency = filter_parameters.output_cycles_per_second / 2.0f;
			if(filter_parameters.high_frequency_cutoff > 0.0) {
				high_pass_frequency = std::min(filter_parameters.high_frequency_cutoff, high_pass_frequency);
			}

			// Make a guess at a good number of taps.
			std::size_t number_of_taps = std::size_t(
				ceilf((filter_parameters.input_cycles_per_second + high_pass_frequency) / high_pass_frequency)
			);
			number_of_taps = (number_of_taps * 2) | 1;

			step_rate_ = filter_parameters.input_cycles_per_second / filter_parameters.output_cycles_per_second;
			position_error_ = 0.0f;

			filter_ = std::make_unique<SignalProcessing::FIRFilter>(
				unsigned(number_of_taps),
				filter_parameters.input_cycles_per_second,
				0.0,
				high_pass_frequency,
				SignalProcessing::FIRFilter::DefaultAttenuation);

			// Pick the new conversion function.
			if(	filter_parameters.input_cycles_per_second == filter_parameters.output_cycles_per_second &&
				filter_parameters.high_frequency_cutoff < 0.0) {
				// If input and output rates exactly match, and no additional cut-off has been specified,
				// just accumulate results and pass on.
				conversion_ = Conversion::Copy;
			} else if(	filter_parameters.input_cycles_per_second > filter_parameters.output_cycles_per_second ||
				(filter_parameters.input_cycles_per_second == filter_parameters.output_cycles_per_second && filter_parameters.high_frequency_cutoff >= 0.0)) {
				// If the output rate is less than the input rate, or an additional cut-off has been specified, use the filter.
				conversion_ = Conversion::ResampleSmaller;
			} else {
				conversion_ = Conversion::ResampleLarger;
			}

			// Do something sensible with any dangling input, if necessary.
			const int scale = static_cast<ConcreteT *>(this)->get_scale();
			switch(conversion_) {
				// Neither direct copying nor resampling larger currently use any temporary input.
				// Although in the latter case that's just because it's unimplemented. But, regardless,
				// that means nothing to do.
				default: break;

				case Conversion::ResampleSmaller: {
					// Reize the input buffer only if absolutely necessary; if sizing downward
					// such that a sample would otherwise be lost then output it now. Keep anything
					// currently in the input buffer that hasn't yet been processed.
					const size_t required_buffer_size = size_t(number_of_taps) * (is_stereo + 1);
					if(input_buffer_.size() != required_buffer_size) {
						if(input_buffer_depth_ >= required_buffer_size) {
							resample_input_buffer(scale);
							input_buffer_depth_ %= required_buffer_size;
						}
						input_buffer_.resize(required_buffer_size);
					}
				} break;
			}
		}